

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O3

CompilerFeaturesHandle __thiscall
cmQtAutoGenGlobalInitializer::GetCompilerFeatures
          (cmQtAutoGenGlobalInitializer *this,string *generator,string *executable,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  iterator iVar5;
  pointer puVar6;
  string *psVar7;
  int *retVal_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  string *in_R8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_false,_true>,_bool>
  pVar9;
  CompilerFeaturesHandle CVar10;
  string_view text;
  string_view text_00;
  string stdOut;
  string stdErr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  int retVal;
  string local_1f8;
  string local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  int local_194;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_100;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  size_type local_c0;
  pointer local_b8;
  undefined8 local_b0;
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  pointer local_98;
  undefined8 local_90;
  char *local_88;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)((long)&generator[3].field_2 + 8);
  psVar7 = error;
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(this_00,error);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar4 = cmsys::SystemTools::FileExists(error,true);
    if (bVar4) {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      local_1f8._M_string_length = 0;
      local_1f8.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_1d8.field_2;
      local_1d8._M_string_length = 0;
      local_1d8.field_2._M_local_buf[0] = '\0';
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
                 error);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
                 (char (*) [3])"-h");
      retVal_00 = &local_194;
      local_194 = 0;
      bVar4 = cmSystemTools::RunSingleCommand
                        (&local_1b8,&local_1f8,&local_1d8,retVal_00,(char *)0x0,OUTPUT_NONE,
                         (cmDuration)0x0,Auto);
      if (bVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,
                          CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                   local_1d8.field_2._M_local_buf[0]) + 1);
        }
        puVar6 = (pointer)operator_new(0x50);
        puVar6[1]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x100000001;
        (puVar6->_M_t).
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)&PTR___Sp_counted_ptr_inplace_0087c460;
        puVar6[2]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x0;
        puVar6[3]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x0;
        puVar6[4]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x0;
        puVar6[5]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x0;
        puVar6[6]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x0;
        puVar6[3]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)(puVar6 + 5);
        puVar6[7]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x0;
        puVar6[8]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x0;
        puVar6[9]._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             (cmQtAutoGenInitializer *)0x0;
        (this->Initializers_).
        super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar6;
        (this->Initializers_).
        super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = puVar6 + 2;
        std::__cxx11::string::operator=((string *)(puVar6 + 3),(string *)&local_1f8);
        pVar9 = std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::
                _M_emplace<std::__cxx11::string_const&,std::shared_ptr<cmQtAutoGen::CompilerFeatures>&>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)this_00,error,this);
        _Var8._M_pi = pVar9._8_8_;
      }
      else {
        pcVar2 = (executable->_M_dataplus)._M_p;
        sVar3 = executable->_M_string_length;
        text_00._M_str = (char *)retVal_00;
        text_00._M_len = (size_t)(error->_M_dataplus)._M_p;
        cmQtAutoGen::Quoted_abi_cxx11_(&local_170,(cmQtAutoGen *)error->_M_string_length,text_00);
        cmQtAutoGen::QuotedCommand(&local_190,&local_1b8);
        local_d0._M_len = 0xd;
        local_d0._M_str = "Test run of \"";
        local_b0 = 0xd;
        local_a8 = "\" executable ";
        local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_170._M_string_length;
        local_98 = local_170._M_dataplus._M_p;
        local_90 = 9;
        local_88 = " failed.\n";
        local_80 = local_190._M_string_length;
        local_78 = local_190._M_dataplus._M_p;
        local_100._M_string_length = (size_type)&local_100.field_2;
        local_100._M_dataplus._M_p = (pointer)0x1;
        local_100.field_2._M_local_buf[0] = '\n';
        local_70 = 1;
        local_60 = local_1f8._M_string_length;
        local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_1f8._M_dataplus._M_p;
        local_130._M_string_length = (size_type)&local_130.field_2;
        local_130._M_dataplus._M_p = (pointer)0x1;
        local_130.field_2._M_local_buf[0] = '\n';
        local_50 = 1;
        local_40 = local_1d8._M_string_length;
        local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_1d8._M_dataplus._M_p;
        views_00._M_len = 10;
        views_00._M_array = &local_d0;
        local_c0 = sVar3;
        local_b8 = pcVar2;
        local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_100._M_string_length;
        local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_130._M_string_length;
        cmCatViews_abi_cxx11_(&local_150,views_00);
        std::__cxx11::string::operator=(in_R8,(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        (this->Initializers_).
        super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (this->Initializers_).
        super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1b8);
        _Var8._M_pi = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,
                          CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                   local_1d8.field_2._M_local_buf[0]) + 1);
          _Var8._M_pi = extraout_RDX_04;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,
                        CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                 local_1f8.field_2._M_local_buf[0]) + 1);
        _Var8._M_pi = extraout_RDX_05;
      }
    }
    else {
      pcVar2 = (executable->_M_dataplus)._M_p;
      sVar3 = executable->_M_string_length;
      text._M_str = (char *)psVar7;
      text._M_len = (size_t)(error->_M_dataplus)._M_p;
      cmQtAutoGen::Quoted_abi_cxx11_(&local_130,(cmQtAutoGen *)error->_M_string_length,text);
      local_d0._M_len = 5;
      local_d0._M_str = "The \"";
      local_b0 = 0xd;
      local_a8 = "\" executable ";
      local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_130._M_string_length;
      local_98 = local_130._M_dataplus._M_p;
      local_90 = 0x10;
      local_88 = " does not exist.";
      views._M_len = 5;
      views._M_array = &local_d0;
      local_c0 = sVar3;
      local_b8 = pcVar2;
      cmCatViews_abi_cxx11_(&local_100,views);
      std::__cxx11::string::operator=(in_R8,(string *)&local_100);
      _Var8._M_pi = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
        _Var8._M_pi = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
        _Var8._M_pi = extraout_RDX_02;
      }
      (this->Initializers_).
      super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->Initializers_).
      super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
  }
  else {
    (this->Initializers_).
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)
          ((long)iVar5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                 ._M_cur + 0x28);
    puVar6 = *(pointer *)
              ((long)iVar5.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                     ._M_cur + 0x30);
    (this->Initializers_).
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar6;
    _Var8._M_pi = extraout_RDX;
    if (puVar6 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&puVar6[1]._M_t.
                 super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                 .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             *(int *)&puVar6[1]._M_t.
                      super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                      .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl + 1;
        UNLOCK();
      }
      else {
        *(int *)&puVar6[1]._M_t.
                 super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                 .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl =
             *(int *)&puVar6[1]._M_t.
                      super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                      .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl + 1;
      }
    }
  }
  CVar10.super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  CVar10.super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CompilerFeaturesHandle)
         CVar10.super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmQtAutoGen::CompilerFeaturesHandle
cmQtAutoGenGlobalInitializer::GetCompilerFeatures(
  std::string const& generator, std::string const& executable,
  std::string& error)
{
  // Check if we have cached features
  {
    auto it = this->CompilerFeatures_.find(executable);
    if (it != this->CompilerFeatures_.end()) {
      return it->second;
    }
  }

  // Check if the executable exists
  if (!cmSystemTools::FileExists(executable, true)) {
    error = cmStrCat("The \"", generator, "\" executable ",
                     cmQtAutoGen::Quoted(executable), " does not exist.");
    return cmQtAutoGen::CompilerFeaturesHandle();
  }

  // Test the executable
  std::string stdOut;
  {
    std::string stdErr;
    std::vector<std::string> command;
    command.emplace_back(executable);
    command.emplace_back("-h");
    int retVal = 0;
    const bool runResult = cmSystemTools::RunSingleCommand(
      command, &stdOut, &stdErr, &retVal, nullptr, cmSystemTools::OUTPUT_NONE,
      cmDuration::zero(), cmProcessOutput::Auto);
    if (!runResult) {
      error = cmStrCat("Test run of \"", generator, "\" executable ",
                       cmQtAutoGen::Quoted(executable), " failed.\n",
                       cmQtAutoGen::QuotedCommand(command), '\n', stdOut, '\n',
                       stdErr);
      return cmQtAutoGen::CompilerFeaturesHandle();
    }
  }

  // Create valid handle
  cmQtAutoGen::CompilerFeaturesHandle res =
    std::make_shared<cmQtAutoGen::CompilerFeatures>();
  res->HelpOutput = std::move(stdOut);

  // Register compiler features
  this->CompilerFeatures_.emplace(executable, res);

  return res;
}